

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O3

any * __thiscall
shadow::conversion_detail::generic_conversion_bind_point<long_double,char>
          (any *__return_storage_ptr__,conversion_detail *this,any *src)

{
  conversion_detail cVar1;
  holder_base *phVar2;
  conversion_detail *pcVar3;
  
  pcVar3 = this + 0x18;
  if (*this != (conversion_detail)0x0) {
    pcVar3 = (conversion_detail *)(*(long *)(this + 0x10) + 8);
  }
  cVar1 = *pcVar3;
  __return_storage_ptr__->on_heap_ = true;
  phVar2 = (holder_base *)operator_new(0x20);
  phVar2->_vptr_holder_base = (_func_int **)&PTR_copy_0012ebc8;
  *(longdouble *)(phVar2 + 2) = (longdouble)(short)(char)cVar1;
  (__return_storage_ptr__->field_1).heap = phVar2;
  return __return_storage_ptr__;
}

Assistant:

any
generic_conversion_bind_point(const any& src)
{
    return conversion_specializer<TargetType, SourceType>::dispatch(src);
}